

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<double>_>::AddKel
          (TPZSkylMatrix<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *source,TPZVec<long> *destination)

{
  complex<double> *pcVar1;
  long lVar2;
  long lVar3;
  int64_t row;
  complex<double> *pcVar4;
  double dVar5;
  double dVar6;
  long lVar7;
  complex<double> *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  lVar2 = source->fNElements;
  lVar11 = 0;
  lVar9 = 0;
  if (0 < lVar2) {
    lVar9 = lVar2;
  }
  for (; lVar11 != lVar9; lVar11 = lVar11 + 1) {
    lVar3 = destination->fStore[lVar11];
    row = source->fStore[lVar11];
    for (lVar10 = lVar11; lVar2 != lVar10; lVar10 = lVar10 + 1) {
      lVar12 = destination->fStore[lVar10];
      lVar7 = -(lVar3 - lVar12);
      lVar13 = lVar3 - lVar12;
      if (lVar13 != 0 && lVar12 <= lVar3) {
        lVar12 = lVar3;
        lVar7 = lVar13;
      }
      pcVar8 = TPZFMatrix<std::complex<double>_>::operator()(elmat,row,source->fStore[lVar10]);
      pcVar4 = (this->fElem).fStore[lVar12];
      dVar5 = *(double *)(pcVar8->_M_value + 8);
      pcVar1 = pcVar4 + lVar7;
      dVar6 = *(double *)(pcVar1->_M_value + 8);
      pcVar4 = pcVar4 + lVar7;
      *(double *)pcVar4->_M_value = *(double *)pcVar1->_M_value + *(double *)pcVar8->_M_value;
      *(double *)(pcVar4->_M_value + 8) = dVar6 + dVar5;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddKel(TPZFMatrix<TVar>&elmat,
                                 TPZVec<int64_t> &source,
                                 TPZVec<int64_t> &destination)
{
    int64_t nelem = source.NElements();
    int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    for(icoef=0; icoef<nelem; icoef++) {
        ieq = destination[icoef];
        ieqs = source[icoef];
        for(jcoef=icoef; jcoef<nelem; jcoef++) {
            jeq = destination[jcoef];
            jeqs = source[jcoef];
            int64_t row(ieq), col(jeq);
            // invertendo linha-coluna para triangular superior
            if (row > col)
                this->Swap(&row, &col);
#ifdef PZDEBUG
            // checando limites
            if(row >= this->Dim() || col >= this->Dim()) {
                cout << "TPZSkylMatrix::GetVal index out of range row = " <<
                row << " col = " << col << endl;
                DebugStop();
            }
#endif
            // indice do vetor coluna
            int64_t index = col - row;
#ifdef PZDEBUG
            // checando limite da coluna
            if (index >= Size(col)) {
                cerr << "Try TPZSkylMatrix gZero." << endl;
                DebugStop();
            }
#endif
            // executando contribuição
            fElem[col][index] += elmat(ieqs,jeqs);

        }
    }
}